

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O0

void __thiscall
cli::Parser::
CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
~CmdArgument(CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this)

{
  CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  ~CmdArgument(this);
  operator_delete(this,0xd0);
  return;
}

Assistant:

explicit CmdArgument(const std::string& name, const std::string& alternative, const std::string& description, bool required, bool dominant) :
				CmdBase(name, alternative, description, required, dominant, ArgumentCountChecker<T>::Variadic) {
			}